

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O1

void container_checked_add(container_t *container,uint16_t val,uint8_t typecode)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  array_container_t *container_00;
  uint64_t *puVar4;
  int iVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  unsigned_long b;
  ulong uVar7;
  uint unaff_R13D;
  uint uVar8;
  uint8_t local_31;
  
  container_00 = (array_container_t *)container;
  local_31 = typecode;
  if ((int)CONCAT71(in_register_00000011,typecode) == 4) {
    container_00 = (array_container_t *)
                   shared_container_extract_copy((shared_container_t *)container,&local_31);
  }
  if (local_31 == '\x03') {
    run_container_add((run_container_t *)container_00,val);
    b = 3;
    goto LAB_00102ced;
  }
  if (local_31 == '\x02') {
    iVar2 = container_00->cardinality;
    if (((long)iVar2 == 0) || ((iVar2 < 0x1000 && (container_00->array[(long)iVar2 + -1] < val)))) {
      if (iVar2 == container_00->capacity) {
        array_container_grow(container_00,container_00->capacity + 1,true);
      }
      iVar2 = container_00->cardinality;
      container_00->cardinality = iVar2 + 1;
      container_00->array[iVar2] = val;
LAB_00102c8e:
      iVar5 = 1;
    }
    else {
      iVar5 = iVar2 + -1;
      uVar6 = 0;
      do {
        if (iVar5 < (int)uVar6) {
          uVar8 = ~uVar6;
          break;
        }
        uVar8 = uVar6 + iVar5 >> 1;
        uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
        if (uVar1 < val) {
          uVar6 = uVar8 + 1;
          bVar3 = true;
          uVar8 = unaff_R13D;
        }
        else if (val < uVar1) {
          iVar5 = uVar8 - 1;
          bVar3 = true;
          uVar8 = unaff_R13D;
        }
        else {
          bVar3 = false;
        }
        unaff_R13D = uVar8;
      } while (bVar3);
      iVar5 = (int)uVar8 >> 0x1f;
      if ((iVar2 < 0x1000) && ((int)uVar8 < 0)) {
        if (iVar2 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        uVar8 = ~uVar8;
        memmove(container_00->array + (ulong)uVar8 + 1,container_00->array + uVar8,
                (long)(int)(iVar2 - uVar8) * 2);
        container_00->array[uVar8] = val;
        container_00->cardinality = container_00->cardinality + 1;
        goto LAB_00102c8e;
      }
    }
    b = 2;
    if (iVar5 != -1) goto LAB_00102ced;
    container_00 = (array_container_t *)bitset_container_from_array(container_00);
    puVar4 = (uint64_t *)container_00->array;
  }
  else {
    puVar4 = (uint64_t *)container_00->array;
  }
  uVar7 = puVar4[val >> 6] | 1L << ((ulong)val & 0x3f);
  container_00->cardinality =
       container_00->cardinality + (int)((puVar4[val >> 6] ^ uVar7) >> ((byte)val & 0x3f));
  puVar4[val >> 6] = uVar7;
  b = 1;
LAB_00102ced:
  _assert_int_equal((ulong)typecode,b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                    ,0x1d);
  _assert_true((ulong)(container_00 == (array_container_t *)container),"container == new_container",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x1e);
  return;
}

Assistant:

static inline void container_checked_add(container_t *container, uint16_t val,
                                         uint8_t typecode) {
    uint8_t new_type;
    container_t *new_container =
        container_add(container, val, typecode, &new_type);
    assert_int_equal(typecode, new_type);
    assert_true(container == new_container);
}